

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::DeleteProperty
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  BOOL BVar5;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  uint32 local_3c;
  PropertyOperationFlags local_38;
  uint32 indexVal;
  PropertyIndex index;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  BVar4 = GetDescriptor(this,propertyId,(PropertyIndex *)((long)&indexVal + 2));
  if (BVar4 == 0) {
    local_38 = propertyOperationFlags;
    bVar3 = DynamicObject::HasObjectArray(instance);
    BVar4 = 1;
    if ((bVar3) &&
       (BVar5 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_3c), BVar5 != 0)) {
      BVar4 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,local_3c,local_38);
    }
  }
  else {
    bVar1 = this->descriptors[indexVal._2_2_].field_1.Attributes;
    if ((bVar1 & 8) == 0) {
      if ((bVar1 & 2) == 0) {
        pPVar6 = ScriptContext::GetPropertyName(this_00,propertyId);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  (propertyOperationFlags,this_00,(PCWSTR)(pPVar6 + 1));
        BVar4 = 0;
      }
      else {
        if ((((this->super_DynamicTypeHandler).flags & 0x20) != 0) ||
           (BVar4 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                              (&instance->super_RecyclableObject,propertyId), BVar4 != 0)) {
          ScriptContext::InvalidateProtoCaches(this_00,propertyId);
        }
        DynamicObject::ChangeType(instance);
        if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
          this = ConvertToNonSharedSimpleType(this,instance);
        }
        SetAttribute(this,instance,indexVal._2_2_,'\b');
        BVar4 = 1;
      }
    }
    else {
      BVar4 = 1;
      if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x298,"(!GetIsLocked())","!GetIsLocked()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
  return BVar4;
}

Assistant:

BOOL SimpleTypeHandler<size>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                return true;
            }
            if (!(descriptors[index].Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            if ((this->GetFlags() & IsPrototypeFlag)
                || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
            {
                // We don't evolve dictionary types when deleting a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.)
                scriptContext->InvalidateProtoCaches(propertyId);
            }

            instance->ChangeType();


            CompileAssert(_countof(descriptors) == size);
            if (size > 1)
            {
                if (GetIsLocked())
                {
                    // Prevent conversion to path type and then dictionary. Remove this when path types support deleted properties.
                    this->ConvertToNonSharedSimpleType(instance)->SetAttribute(instance, index, PropertyDeleted);
                }
                else
                {
                    SetAttribute(instance, index, PropertyDeleted);
                }
            }
            else
            {
                SetSlotUnchecked(instance, index, nullptr);

                NullTypeHandlerBase* nullTypeHandler = ((this->GetFlags() & IsPrototypeFlag) != 0) ?
                    (NullTypeHandlerBase*)NullTypeHandler<true>::GetDefaultInstance() : (NullTypeHandlerBase*)NullTypeHandler<false>::GetDefaultInstance();
                if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
                {
                    nullTypeHandler->ClearHasOnlyWritableDataProperties();
                }
                SetInstanceTypeHandler(instance, nullTypeHandler, false);
            }

            return true;
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::DeleteItem(instance, indexVal, propertyOperationFlags);
        }

        return true;
    }